

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O2

void __thiscall sysapi::epoll_registration::swap(epoll_registration *this,epoll_registration *other)

{
  int iVar1;
  uint32_t uVar2;
  epoll *peVar3;
  
  peVar3 = this->ep;
  this->ep = other->ep;
  other->ep = peVar3;
  iVar1 = this->fd;
  this->fd = other->fd;
  other->fd = iVar1;
  uVar2 = this->events;
  this->events = other->events;
  other->events = uVar2;
  std::function<void_(unsigned_int)>::swap(&this->callback,&other->callback);
  update(this);
  update(other);
  return;
}

Assistant:

void epoll_registration::swap(epoll_registration& other)
{
    std::swap(ep,       other.ep);
    std::swap(fd,       other.fd);
    std::swap(events,   other.events);
    std::swap(callback, other.callback);
    update();
    other.update();
}